

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O2

void __thiscall ParialSphere_Normal_Test::TestBody(ParialSphere_Normal_Test *this)

{
  undefined1 auVar1 [16];
  Float zMax;
  Float *pFVar3;
  Point3f *pPVar4;
  ShapeIntersection *pSVar5;
  char *message;
  int c;
  int iVar6;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  undefined1 auVar15 [56];
  undefined1 extraout_var_00 [60];
  undefined1 auVar10 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar17 [60];
  undefined1 auVar16 [64];
  Point3<float> PVar18;
  Vector3<float> VVar19;
  Normal3<float> NVar20;
  Point3f PVar21;
  Float local_2a4;
  Float local_2a0;
  Float local_29c;
  undefined1 local_298 [16];
  AssertionResult gtest_ar;
  undefined1 local_270 [8];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  Ray local_248;
  uint64_t local_220;
  AssertHelper local_218;
  Bounds3f bbox;
  Sphere sphere;
  RNG rng;
  optional<pbrt::ShapeIntersection> si;
  Transform identity;
  undefined1 auVar2 [16];
  
  for (local_220 = 0; local_220 != 100; local_220 = local_220 + 1) {
    pbrt::RNG::SetSequence(&rng,local_220);
    pbrt::Transform::Transform(&identity);
    local_298._0_4_ = pExp(&rng,4.0);
    local_298._4_4_ = extraout_XMM0_Db;
    local_298._8_4_ = extraout_XMM0_Dc;
    local_298._12_4_ = extraout_XMM0_Dd;
    fVar7 = pbrt::RNG::Uniform<float>(&rng);
    if (0.5 <= fVar7) {
      fVar7 = pbrt::RNG::Uniform<float>(&rng);
      local_258 = vfnmadd231ss_fma(ZEXT416((uint)(local_298._0_4_ * fVar7)),local_298,
                                   ZEXT416((uint)(1.0 - fVar7)));
    }
    else {
      auVar2._8_4_ = 0x80000000;
      auVar2._0_8_ = 0x8000000080000000;
      auVar2._12_4_ = 0x80000000;
      local_258 = vxorps_avx512vl(local_298,auVar2);
    }
    fVar7 = pbrt::RNG::Uniform<float>(&rng);
    zMax = (Float)local_298._0_4_;
    if (0.5 <= fVar7) {
      fVar7 = pbrt::RNG::Uniform<float>(&rng);
      auVar2 = vfnmadd231ss_fma(ZEXT416((uint)(local_298._0_4_ * fVar7)),local_298,
                                ZEXT416((uint)(1.0 - fVar7)));
      zMax = auVar2._0_4_;
    }
    fVar8 = pbrt::RNG::Uniform<float>(&rng);
    fVar7 = 360.0;
    if (0.5 <= fVar8) {
      fVar7 = pbrt::RNG::Uniform<float>(&rng);
      fVar7 = fVar7 * 360.0;
    }
    auVar9 = ZEXT1664(local_298);
    pbrt::Sphere::Sphere
              (&sphere,&identity,&identity,false,local_298._0_4_,local_258._0_4_,zMax,fVar7);
    local_29c = 0.0;
    local_2a0 = 0.0;
    local_2a4 = 0.0;
    for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
      auVar9._0_4_ = pExp(&rng,8.0);
      auVar9._4_60_ = extraout_var;
      pFVar3 = &local_29c;
      if (iVar6 != 0) {
        if (iVar6 == 1) {
          pFVar3 = &local_2a0;
        }
        else {
          pFVar3 = &local_2a4;
        }
      }
      *pFVar3 = auVar9._0_4_;
    }
    pbrt::Sphere::Bounds(&bbox,&sphere);
    local_270._0_4_ = 0.0;
    local_270._4_4_ = 0.0;
    local_268._0_4_ = 0.0;
    for (iVar6 = 0; auVar15 = auVar9._8_56_, iVar6 != 3; iVar6 = iVar6 + 1) {
      auVar9._0_4_ = pbrt::RNG::Uniform<float>(&rng);
      auVar9._4_60_ = extraout_var_00;
      pPVar4 = (Point3f *)local_270;
      if ((iVar6 != 0) && (pPVar4 = (Point3f *)(local_270 + 4), iVar6 != 1)) {
        pPVar4 = (Point3f *)local_268;
      }
      (pPVar4->super_Tuple3<pbrt::Point3,_float>).x = auVar9._0_4_;
    }
    PVar18 = pbrt::Bounds3<float>::Lerp(&bbox,(Point3f *)local_270);
    auVar10._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar15;
    auVar2 = vinsertps_avx(ZEXT416((uint)local_29c),ZEXT416((uint)local_2a0),0x10);
    local_248.d.super_Tuple3<pbrt::Vector3,_float>.z =
         PVar18.super_Tuple3<pbrt::Point3,_float>.z - local_2a4;
    local_248.o.super_Tuple3<pbrt::Point3,_float>.x = local_29c;
    local_248.o.super_Tuple3<pbrt::Point3,_float>.y = local_2a0;
    local_248.o.super_Tuple3<pbrt::Point3,_float>.z = local_2a4;
    auVar2 = vsubps_avx(auVar10._0_16_,auVar2);
    local_248.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar2);
    local_248.time = 0.0;
    local_248.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    fVar7 = pbrt::RNG::Uniform<float>(&rng);
    auVar17 = (undefined1  [60])0x0;
    if (fVar7 < 0.5) {
      auVar15 = extraout_var_01;
      VVar19 = pbrt::Normalize<float>(&local_248.d);
      local_248.d.super_Tuple3<pbrt::Vector3,_float>.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z
      ;
      auVar11._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar11._8_56_ = auVar15;
      local_248.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar11._0_16_);
    }
    auVar15 = (undefined1  [56])0x0;
    pbrt::Sphere::Intersect(&si,&sphere,&local_248,INFINITY);
    if (si.set == true) {
      pSVar5 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      NVar20 = pbrt::Normalize<float>(&(pSVar5->intr).super_Interaction.n);
      auVar12._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar12._8_56_ = auVar15;
      local_298 = auVar12._0_16_;
      local_258._0_4_ = NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
      pSVar5 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      PVar21 = pbrt::Interaction::p((Interaction *)pSVar5);
      gtest_ar.message_.ptr_._0_4_ = PVar21.super_Tuple3<pbrt::Point3,_float>.z;
      auVar13._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar13._8_56_ = auVar15;
      gtest_ar._0_8_ = vmovlps_avx(auVar13._0_16_);
      VVar19 = pbrt::Normalize<float>((Vector3<float> *)&gtest_ar);
      auVar16._0_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar16._4_60_ = auVar17;
      auVar14._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14._8_56_ = auVar15;
      auVar2 = vmovshdup_avx(auVar14._0_16_);
      auVar1 = vmovshdup_avx(local_298);
      auVar2 = vfmadd213ss_fma(auVar2,auVar1,ZEXT416((uint)((float)local_258._0_4_ * auVar16._0_4_))
                              );
      auVar1 = vfmsub213ss_fma(auVar16._0_16_,ZEXT416((uint)local_258._0_4_),
                               ZEXT416((uint)((float)local_258._0_4_ * auVar16._0_4_)));
      auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ + auVar1._0_4_)),local_298,auVar14._0_16_
                              );
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"1.","dot",1.0,auVar2._0_4_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)(local_268 + 8));
        message = "";
        if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
            (undefined8 *)0x0) {
          message = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_218,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                   ,0x185,message);
        testing::internal::AssertHelper::operator=(&local_218,(Message *)(local_268 + 8));
        testing::internal::AssertHelper::~AssertHelper(&local_218);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_268 + 8));
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  }
  return;
}

Assistant:

TEST(ParialSphere, Normal) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Transform identity;
        Float radius = pExp(rng, 4);
        Float zMin = rng.Uniform<Float>() < 0.5
                         ? -radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float zMax = rng.Uniform<Float>() < 0.5
                         ? radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float phiMax = rng.Uniform<Float>() < 0.5 ? 360. : rng.Uniform<Float>() * 360.;
        Sphere sphere(&identity, &identity, false, radius, zMin, zMax, phiMax);

        // Ray origin
        Point3f o;
        for (int c = 0; c < 3; ++c)
            o[c] = pExp(rng);

        // Destination: a random point in the shape's bounding box.
        Bounds3f bbox = sphere.Bounds();
        Point3f t;
        for (int c = 0; c < 3; ++c)
            t[c] = rng.Uniform<Float>();
        Point3f p2 = bbox.Lerp(t);

        // Ray to intersect with the shape.
        Ray r(o, p2 - o);
        if (rng.Uniform<Float>() < .5)
            r.d = Normalize(r.d);

        // We should usually (but not always) find an intersection.
        auto si = sphere.Intersect(r, Infinity);
        if (!si)
            continue;

        Float dot = Dot(Normalize(si->intr.n), Normalize(Vector3f(si->intr.p())));
        EXPECT_FLOAT_EQ(1., dot);
    }
}